

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

float __thiscall logloss::wexpmx(logloss *this,float x)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (double)x;
  if (1.0 <= x) {
    __x = dVar1 * 0.86 + 0.01;
    dVar2 = log(__x);
    dVar2 = dVar1 - dVar2;
  }
  else {
    __x = exp(dVar1 * 0.8 + -0.65);
    dVar2 = dVar1 * 0.2 + 0.65;
  }
  dVar2 = dVar2 - __x;
  dVar3 = __x + 1.0;
  dVar4 = ((dVar2 + dVar2) / 3.0 + dVar3) * (dVar3 + dVar3);
  return (float)((((dVar2 / dVar3) * (dVar4 - dVar2)) / (dVar4 - (dVar2 + dVar2)) + 1.0) * __x -
                dVar1);
}

Assistant:

inline float wexpmx(float x)
  {
    /* This piece of code is approximating W(exp(x))-x.
     * W is the Lambert W function: W(z)*exp(W(z))=z.
     * The absolute error of this approximation is less than 9e-5.
     * Faster/better approximations can be substituted here.
     */
    double w = x >= 1. ? 0.86 * x + 0.01 : correctedExp(0.8 * x - 0.65);  // initial guess
    double r = x >= 1. ? x - log(w) - w : 0.2 * x + 0.65 - w;             // residual
    double t = 1. + w;
    double u = 2. * t * (t + 2. * r / 3.);                          // magic
    return (float)(w * (1. + r / t * (u - r) / (u - 2. * r)) - x);  // more magic
  }